

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode CVar2;
  void *pvVar3;
  
  pCVar1 = conn->data;
  pvVar3 = (*Curl_ccalloc)(0x50,1);
  (pCVar1->req).protop = pvVar3;
  CVar2 = CURLE_OUT_OF_MEMORY;
  if (pvVar3 != (void *)0x0) {
    conn->tls_upgraded = false;
    CVar2 = CURLE_OK;
  }
  return CVar2;
}

Assistant:

static CURLcode imap_setup_connection(struct connectdata *conn)
{
  /* Initialise the IMAP layer */
  CURLcode result = imap_init(conn);
  if(result)
    return result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;

  return CURLE_OK;
}